

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction.cpp
# Opt level: O2

void __thiscall cfd::core::Transaction::Transaction(Transaction *this,Transaction *transaction)

{
  string local_30;
  
  AbstractTransaction::GetHex_abi_cxx11_(&local_30,&transaction->super_AbstractTransaction);
  Transaction(this,&local_30);
  ::std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

Transaction::Transaction(const Transaction &transaction)
    : Transaction(transaction.GetHex()) {
  // copy constructor
}